

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_21::ValidateSingleFeatureLifetimes
          (anon_unknown_21 *this,Edition edition,string_view full_name,FeatureSupport *support,
          ValidationResults *results)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_t sVar3;
  undefined4 in_register_00000034;
  undefined8 uVar4;
  Edition edition_00;
  _Alloc_hider _Var5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_01;
  string local_f8;
  string local_d8;
  StringifySink local_b8;
  FeatureSupport *local_98;
  undefined8 local_90;
  char *local_88;
  undefined8 local_80;
  size_t local_78;
  undefined8 local_70;
  char *local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined8 local_50;
  char *local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  uVar4 = CONCAT44(in_register_00000034,edition);
  pcVar2 = full_name._M_str;
  sVar3 = full_name._M_len;
  if (pcVar2 == _FieldOptions_FeatureSupport_default_instance_) {
    return;
  }
  edition_00 = (Edition)this;
  if ((int)edition_00 < (int)*(Edition *)(pcVar2 + 0x20)) {
    paVar1 = &local_b8.buffer_.field_2;
    local_b8.buffer_.field_2._8_8_ = 0;
    local_b8.buffer_._M_string_length = 0;
    local_b8.buffer_.field_2._M_allocated_capacity = 0;
    local_b8.buffer_._M_dataplus._M_p = (pointer)paVar1;
    local_98 = support;
    AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
              (&local_b8,*(Edition *)(pcVar2 + 0x20));
    local_90 = 8;
    local_88 = "Feature ";
    local_70 = 0x21;
    local_68 = " wasn\'t introduced until edition ";
    local_60 = local_b8.buffer_._M_string_length;
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_b8.buffer_._M_dataplus._M_p;
    local_50 = 0x1e;
    local_48 = " and can\'t be used in edition ";
    local_f8.field_2._8_8_ = 0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_80 = uVar4;
    local_78 = sVar3;
    AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
              ((StringifySink *)&local_f8,edition_00);
    local_40 = local_f8._M_string_length;
    local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_f8._M_dataplus._M_p;
    pieces._M_len = local_f8._M_string_length;
    pieces._M_array = (iterator)&DAT_00000006;
    absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
              (&local_d8,(strings_internal *)&local_90,pieces);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    support = local_98;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_98,
               &local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.buffer_._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8.buffer_._M_dataplus._M_p,
                      local_b8.buffer_.field_2._M_allocated_capacity + 1);
    }
  }
  if (((*(uint *)(pcVar2 + 0x10) & 8) == 0) || ((int)edition_00 < (int)*(Edition *)(pcVar2 + 0x28)))
  {
    if ((*(uint *)(pcVar2 + 0x10) & 4) == 0) {
      return;
    }
    if ((int)edition_00 < (int)*(Edition *)(pcVar2 + 0x24)) {
      return;
    }
    local_d8.field_2._8_8_ = 0;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_allocated_capacity = 0;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
              ((StringifySink *)&local_d8,*(Edition *)(pcVar2 + 0x24));
    local_90 = 8;
    local_88 = "Feature ";
    local_70 = 0x20;
    local_68 = " has been deprecated in edition ";
    local_60 = local_d8._M_string_length;
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_d8._M_dataplus._M_p;
    local_50 = 2;
    local_48 = ": ";
    local_38 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)(*(ulong *)(pcVar2 + 0x18) & 0xfffffffffffffffc);
    local_40 = ((long *)(*(ulong *)(pcVar2 + 0x18) & 0xfffffffffffffffc))[1];
    pieces_00._M_len = local_40;
    pieces_00._M_array = (iterator)&DAT_00000006;
    local_80 = uVar4;
    local_78 = sVar3;
    absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
              (&local_f8,(strings_internal *)&local_90,pieces_00);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &(support->field_0)._impl_.deprecation_warning_,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    uVar4 = local_d8.field_2._M_allocated_capacity;
    _Var5._M_p = local_d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
      return;
    }
  }
  else {
    paVar1 = &local_b8.buffer_.field_2;
    local_b8.buffer_.field_2._8_8_ = 0;
    local_b8.buffer_._M_string_length = 0;
    local_b8.buffer_.field_2._M_allocated_capacity = 0;
    local_b8.buffer_._M_dataplus._M_p = (pointer)paVar1;
    AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
              (&local_b8,*(Edition *)(pcVar2 + 0x28));
    local_90 = 8;
    local_88 = "Feature ";
    local_70 = 0x1d;
    local_68 = " has been removed in edition ";
    local_60 = local_b8.buffer_._M_string_length;
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_b8.buffer_._M_dataplus._M_p;
    local_50 = 0x1e;
    local_48 = " and can\'t be used in edition ";
    local_f8.field_2._8_8_ = 0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_80 = uVar4;
    local_78 = sVar3;
    AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
              ((StringifySink *)&local_f8,edition_00);
    local_40 = local_f8._M_string_length;
    local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_f8._M_dataplus._M_p;
    pieces_01._M_len = local_f8._M_string_length;
    pieces_01._M_array = (iterator)&DAT_00000006;
    absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
              (&local_d8,(strings_internal *)&local_90,pieces_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)support,
               &local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    uVar4 = local_b8.buffer_.field_2._M_allocated_capacity;
    _Var5._M_p = local_b8.buffer_._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.buffer_._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(_Var5._M_p,uVar4 + 1);
  return;
}

Assistant:

void ValidateSingleFeatureLifetimes(
    Edition edition, absl::string_view full_name,
    const FieldOptions::FeatureSupport& support,
    FeatureResolver::ValidationResults& results) {
  // Skip fields that don't have feature support specified.
  if (&support == &FieldOptions::FeatureSupport::default_instance()) return;

  if (edition < support.edition_introduced()) {
    results.errors.emplace_back(
        absl::StrCat("Feature ", full_name, " wasn't introduced until edition ",
                     support.edition_introduced(),
                     " and can't be used in edition ", edition));
  }
  if (support.has_edition_removed() && edition >= support.edition_removed()) {
    results.errors.emplace_back(absl::StrCat(
        "Feature ", full_name, " has been removed in edition ",
        support.edition_removed(), " and can't be used in edition ", edition));
  } else if (support.has_edition_deprecated() &&
             edition >= support.edition_deprecated()) {
    results.warnings.emplace_back(absl::StrCat(
        "Feature ", full_name, " has been deprecated in edition ",
        support.edition_deprecated(), ": ", support.deprecation_warning()));
  }
}